

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O3

bool CreateNativeArrays(ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  uint sourceContextId;
  FunctionBody *functionBody;
  undefined4 *puVar4;
  FunctionInfo *pFVar5;
  
  if ((funcInfo == (FuncInfo *)0x0) ||
     (functionBody = FuncInfo::GetParsedFunctionBody(funcInfo), functionBody == (FunctionBody *)0x0)
     ) {
    bVar3 = Js::Phases::IsEnabledForAll((Phases *)&DAT_015a4e90,NativeArrayPhase);
    if (bVar3) {
      return false;
    }
    bVar3 = true;
    functionBody = (FunctionBody *)0x0;
  }
  else {
    sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
    pFVar5 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar5 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
      pFVar5 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    bVar3 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015a4e90,NativeArrayPhase,sourceContextId,pFVar5->functionId);
    if (bVar3) {
      return false;
    }
    bVar3 = false;
  }
  bVar1 = byteCodeGenerator->m_utf8SourceInfo->field_0xa8;
  if ((byte)((bVar1 >> 5 |
             (byteCodeGenerator->m_utf8SourceInfo->debugModeSource).ptr != (uchar *)0x0) &
            (bVar1 & 0x40) >> 6) != 0) {
    return false;
  }
  if (!bVar3) {
    bVar3 = Js::DynamicProfileInfo::IsEnabled(NativeArrayPhase,functionBody);
    return bVar3;
  }
  bVar3 = Js::DynamicProfileInfo::IsEnabledForAtLeastOneFunction
                    (NativeArrayPhase,byteCodeGenerator->scriptContext);
  return bVar3;
}

Assistant:

bool CreateNativeArrays(ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo)
{
#if ENABLE_PROFILE_INFO
    Js::FunctionBody *functionBody = funcInfo ? funcInfo->GetParsedFunctionBody() : nullptr;

    return
        !PHASE_OFF_OPTFUNC(Js::NativeArrayPhase, functionBody) &&
        !byteCodeGenerator->IsInDebugMode() &&
        (
            functionBody
                ? Js::DynamicProfileInfo::IsEnabled(Js::NativeArrayPhase, functionBody)
                : Js::DynamicProfileInfo::IsEnabledForAtLeastOneFunction(
                    Js::NativeArrayPhase,
                    byteCodeGenerator->GetScriptContext())
        );
#else
    return false;
#endif
}